

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

CRef __thiscall Glucose::Solver::propagate(Solver *this)

{
  Watcher *pWVar1;
  Watcher *pWVar2;
  int iVar3;
  Lit p;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  vec<Glucose::Solver::Watcher> *this_00;
  Lit LVar9;
  byte bVar10;
  undefined8 *puVar11;
  Watcher *pWVar12;
  long lVar13;
  uint uVar14;
  Watcher *pWVar15;
  vec<Glucose::Solver::Watcher> *pvVar16;
  ulong uVar17;
  long lVar18;
  lbool local_91;
  Watcher w;
  ulong local_80;
  uint local_60;
  
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watches);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  local_60 = 0xffffffff;
  uVar14 = 0;
LAB_0010ea97:
  iVar3 = this->qhead;
  if ((this->trail).sz <= iVar3) {
    this->propagations = this->propagations + (ulong)uVar14;
    this->simpDB_props = this->simpDB_props - (ulong)uVar14;
    return local_60;
  }
  this->qhead = iVar3 + 1;
  p.x = (this->trail).data[iVar3].x;
  this_00 = (this->watches).occs.data + p.x;
  uVar14 = uVar14 + 1;
  pvVar16 = (this->watchesBin).occs.data + p.x;
  for (lVar13 = 0; lVar13 < pvVar16->sz; lVar13 = lVar13 + 1) {
    LVar9.x = pvVar16->data[lVar13].blocker.x;
    bVar10 = (byte)LVar9.x & 1;
    w.cref = CONCAT31(w.cref._1_3_,(this->assigns).data[LVar9.x >> 1].value ^ bVar10);
    bVar7 = lbool::operator==((lbool *)&w,(lbool)0x1);
    if (bVar7) {
      return pvVar16->data[lVar13].cref;
    }
    w.cref = CONCAT31(w.cref._1_3_,bVar10 ^ (this->assigns).data[LVar9.x >> 1].value);
    bVar7 = lbool::operator==((lbool *)&w,(lbool)0x2);
    if (bVar7) {
      uncheckedEnqueue(this,LVar9,pvVar16->data[lVar13].cref);
    }
  }
  pWVar15 = this_00->data;
  pWVar1 = pWVar15 + this_00->sz;
  uVar8 = p.x ^ 1;
  pWVar12 = pWVar15;
LAB_0010ebaa:
  do {
    lVar13 = 0;
    while( true ) {
      pWVar2 = (Watcher *)((long)&pWVar15->cref + lVar13);
      if (pWVar2 == pWVar1) {
        vec<Glucose::Solver::Watcher>::shrink
                  (this_00,(int)((ulong)((long)pWVar1 + (-lVar13 - (long)pWVar12)) >> 3));
        if ((this->useUnaryWatched == true) && (local_60 == 0xffffffff)) {
          local_60 = propagateUnaryWatches(this,p);
        }
        goto LAB_0010ea97;
      }
      iVar3 = *(int *)((long)&(pWVar15->blocker).x + lVar13);
      w.cref = CONCAT31(w.cref._1_3_,(byte)iVar3 & 1 ^ (this->assigns).data[iVar3 >> 1].value);
      bVar7 = lbool::operator==((lbool *)&w,(lbool)0x0);
      if (!bVar7) break;
      *(Watcher *)((long)&pWVar12->cref + lVar13) = *pWVar2;
      lVar13 = lVar13 + 8;
    }
    uVar4 = *(uint *)((long)&pWVar15->cref + lVar13);
    puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    LVar9.x = puVar5[(ulong)uVar4 + 3];
    if (LVar9.x == uVar8) {
      LVar9.x = puVar5[(ulong)uVar4 + 4];
      puVar5[(ulong)uVar4 + 3] = LVar9.x;
      puVar5[(ulong)uVar4 + 4] = uVar8;
    }
    pWVar15 = (Watcher *)((long)&pWVar15[1].cref + lVar13);
    w.cref = uVar4;
    w.blocker.x = LVar9.x;
    if (LVar9.x != iVar3) {
      local_91.value = (byte)LVar9.x & 1 ^ (this->assigns).data[LVar9.x >> 1].value;
      bVar7 = lbool::operator==(&local_91,(lbool)0x0);
      if (bVar7) {
        puVar11 = (undefined8 *)((long)&pWVar12->cref + lVar13);
        *puVar11 = CONCAT44(w.blocker.x,w.cref);
        pWVar12 = (Watcher *)(puVar11 + 1);
        goto LAB_0010ebaa;
      }
    }
    if (this->incremental == 0) {
      lVar6 = 2;
      do {
        lVar18 = lVar6;
        if ((int)puVar5[(ulong)uVar4 + 1] <= lVar18) goto LAB_0010ee45;
        local_91.value =
             (byte)puVar5[(ulong)uVar4 + lVar18 + 3] & 1 ^
             (this->assigns).data[(int)puVar5[(ulong)uVar4 + lVar18 + 3] >> 1].value;
        bVar7 = lbool::operator!=(&local_91,(lbool)0x1);
        lVar6 = lVar18 + 1;
      } while (!bVar7);
      puVar5[(ulong)uVar4 + 4] = puVar5[(ulong)uVar4 + lVar18 + 3];
      puVar5[(ulong)uVar4 + lVar18 + 3] = uVar8;
      uVar4 = puVar5[(ulong)uVar4 + 4];
LAB_0010ee21:
      vec<Glucose::Solver::Watcher>::push((this->watches).occs.data + ((long)(int)uVar4 ^ 1),&w);
      pWVar12 = (Watcher *)((long)&pWVar12->cref + lVar13);
    }
    else {
      local_80 = 0xffffffff;
      for (uVar17 = 2; (long)uVar17 < (long)(int)puVar5[(ulong)uVar4 + 1]; uVar17 = uVar17 + 1) {
        local_91.value =
             (byte)puVar5[(ulong)uVar4 + uVar17 + 3] & 1 ^
             (this->assigns).data[(int)puVar5[(ulong)uVar4 + uVar17 + 3] >> 1].value;
        bVar7 = lbool::operator!=(&local_91,(lbool)0x1);
        if (bVar7) {
          local_80._0_4_ = (int)uVar17;
          if ((this->assumptions).sz < (this->trail_lim).sz) goto LAB_0010ee09;
          local_91.value =
               (byte)puVar5[(ulong)uVar4 + uVar17 + 3] & 1 ^
               (this->assigns).data[(int)puVar5[(ulong)uVar4 + uVar17 + 3] >> 1].value;
          bVar7 = lbool::operator==(&local_91,(lbool)0x0);
          if (((bVar7) || (this->incremental == 0)) ||
             ((int)puVar5[(ulong)uVar4 + uVar17 + 3] >> 1 <= this->nbVarsInitialFormula))
          goto LAB_0010ee09;
          local_80 = uVar17 & 0xffffffff;
        }
      }
      if ((int)local_80 != -1) {
LAB_0010ee09:
        puVar5[(ulong)uVar4 + 4] = puVar5[(ulong)uVar4 + (long)(int)local_80 + 3];
        puVar5[(ulong)uVar4 + (long)(int)local_80 + 3] = uVar8;
        uVar4 = puVar5[(ulong)uVar4 + 4];
        goto LAB_0010ee21;
      }
LAB_0010ee45:
      puVar11 = (undefined8 *)((long)&pWVar12->cref + lVar13);
      pWVar12 = (Watcher *)(puVar11 + 1);
      *puVar11 = CONCAT44(w.blocker.x,w.cref);
      local_91.value = (byte)LVar9.x & 1 ^ (this->assigns).data[LVar9.x >> 1].value;
      bVar7 = lbool::operator==(&local_91,(lbool)0x1);
      if (bVar7) {
        this->qhead = (this->trail).sz;
        for (; local_60 = uVar4, pWVar15 < pWVar1; pWVar15 = pWVar15 + 1) {
          *pWVar12 = *pWVar15;
          pWVar12 = pWVar12 + 1;
        }
      }
      else {
        uncheckedEnqueue(this,LVar9,uVar4);
      }
    }
  } while( true );
}

Assistant:

CRef Solver::propagate() {
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    while(qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec <Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec <Watcher> &wbin = watchesBin[p];
        for(int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if(value(imp) == l_False) {
                return wbin[k].cref;
            }

            if(value(imp) == l_Undef) {
                uncheckedEnqueue(imp, wbin[k].cref);
            }
        }

        // Now propagate other 2-watched clauses
        for(i = j = (Watcher *) ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if(value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            assert(!c.getOneWatched());
            Lit false_lit = ~p;
            if(c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            Watcher w = Watcher(cr, first);
            if(first != blocker && value(first) == l_True) {

                *j++ = w;
                continue;
            }
#ifdef INCREMENTAL
            if(incremental) { // ----------------- INCREMENTAL MODE
              int choosenPos = -1;
              for (int k = 2; k < c.size(); k++) {

            if (value(c[k]) != l_False){
              if(decisionLevel()>assumptions.size()) {
                choosenPos = k;
                break;
              } else {
                choosenPos = k;

                if(value(c[k])==l_True || !isSelector(var(c[k]))) {
                  break;
                }
              }

            }
              }
              if(choosenPos!=-1) {
            c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            watches[~c[1]].push(w);
            goto NextClause; }
            } else {  // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
#endif
            for(int k = 2; k < c.size(); k++) {

                if(value(c[k]) != l_False) {
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                }
            }
#ifdef INCREMENTAL
            }
#endif
            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if(value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while(i < end)
                    *j++ = *i++;
            } else {
                uncheckedEnqueue(first, cr);


            }
            NextClause:;
        }
        ws.shrink(i - j);

        // unaryWatches "propagation"
        if(useUnaryWatched && confl == CRef_Undef) {
            confl = propagateUnaryWatches(p);

        }

    }


    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}